

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

matches * atomtab_a(iasctx *ctx,void *v,int spos)

{
  uint uVar1;
  matches *a;
  matches *b;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint *puVar5;
  byte bVar6;
  match sm;
  match in_stack_fffffffffffffe68;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  int local_b8;
  
  bVar6 = 0;
  a = (matches *)calloc(0x10,1);
  puVar5 = (uint *)((long)v + 0x314);
  while( true ) {
    if (((puVar5[-1] == 0) || ((puVar5[-1] & ~*ctx->varinfo->fmask) == 0)) &&
       ((*puVar5 == 0 ||
        ((uVar1 = *ctx->varinfo->modes, uVar1 != 0xffffffff &&
         ((*puVar5 >> (uVar1 & 0x1f) & 1) != 0)))))) {
      memset(&local_e0,0,0xb8);
      local_d8 = *(undefined8 *)(puVar5 + -0xc5);
      local_c8 = *(undefined8 *)(puVar5 + -0xc3);
      local_b8 = spos;
      puVar3 = &local_e0;
      puVar4 = (undefined8 *)&stack0xfffffffffffffe68;
      for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      }
      b = tabdesc(ctx,in_stack_fffffffffffffe68,(atom *)(puVar5 + -0xc1));
      if (b != (matches *)0x0) {
        catmatches(a,b);
      }
    }
    if (((*(long *)(puVar5 + -0xc3) == 0) && (puVar5[-1] == 0)) && (*puVar5 == 0)) break;
    puVar5 = puVar5 + 0xc6;
  }
  return a;
}

Assistant:

struct matches *atomtab_a APROTO {
	const struct insn *tab = v;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; ; i++) {
		if (var_ok(tab[i].fmask, tab[i].ptype, ctx->varinfo)) {
			struct match sm = { 0, .a = {tab[i].val}, .m = {tab[i].mask}, .lpos = spos };
			struct matches *subm = tabdesc(ctx, sm, tab[i].atoms);
			if (subm)
				res = catmatches(res, subm);
		}
		if (!tab[i].mask && !tab[i].fmask && !tab[i].ptype) break;
	}
	return res;
}